

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O0

void __thiscall
HEkk::debugReportReinvertOnNumericalTrouble
          (HEkk *this,string *method_name,double numerical_trouble_measure,double alpha_from_col,
          double alpha_from_row,double numerical_trouble_tolerance,bool reinvert)

{
  undefined4 uVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte in_DL;
  int __x;
  long in_RDI;
  long lVar6;
  HighsLogType HVar7;
  double in_XMM0_Qa;
  HighsLogOptions *extraout_XMM0_Qa;
  char *extraout_XMM0_Qa_00;
  HighsLogOptions *in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  string adjective;
  bool wrong_sign;
  bool near_numerical_trouble;
  bool numerical_trouble;
  string model_name;
  HighsInt update_count;
  HighsInt iteration_count;
  double abs_alpha_diff;
  double abs_alpha_from_row;
  double abs_alpha_from_col;
  string local_a0 [32];
  undefined4 local_80;
  byte local_7b;
  byte local_7a;
  byte local_79;
  string local_78 [32];
  undefined4 local_58;
  uint local_54;
  char *local_50;
  HighsLogType local_48;
  HighsLogOptions *local_40;
  byte local_31;
  double local_30;
  double local_28;
  HighsLogOptions *local_20;
  double local_18;
  
  local_31 = in_DL & 1;
  if (0 < *(int *)(*(long *)(in_RDI + 8) + 0x15c)) {
    lVar6 = in_RDI;
    local_30 = in_XMM3_Qa;
    local_28 = in_XMM2_Qa;
    local_20 = in_XMM1_Qa;
    local_18 = in_XMM0_Qa;
    std::abs((int)in_RDI);
    __x = (int)lVar6;
    local_40 = extraout_XMM0_Qa;
    std::abs(__x);
    _local_48 = _HVar7;
    std::abs(__x);
    local_54 = *(uint *)(in_RDI + 0x36f8);
    local_58 = *(undefined4 *)(in_RDI + 0x2944);
    local_50 = extraout_XMM0_Qa_00;
    std::__cxx11::string::string(local_78,(string *)(in_RDI + 0x2298));
    local_79 = local_30 < local_18;
    local_7a = local_30 < local_18 * 10.0;
    local_7b = (double)local_20 * local_28 <= 0.0;
    if (((bool)local_7a) || ((bool)local_7b)) {
      std::__cxx11::string::string(local_a0);
      if ((local_79 & 1) == 0) {
        if ((local_7a & 1) == 0) {
          std::__cxx11::string::operator=(local_a0,"clearly satisfies");
        }
        else {
          std::__cxx11::string::operator=(local_a0,"almost exceeds");
        }
      }
      else {
        std::__cxx11::string::operator=(local_a0,"       exceeds");
      }
      lVar6 = *(long *)(in_RDI + 8);
      uVar3 = std::__cxx11::string::c_str();
      uVar4 = std::__cxx11::string::c_str();
      uVar2 = local_54;
      uVar1 = local_58;
      uVar5 = std::__cxx11::string::c_str();
      highsLogDev(local_40,_local_48,local_50,local_18,local_30,lVar6 + 0x380,4,
                  "%s (%s) [Iter %d; Update %d] Col: %11.4g; Row: %11.4g; Diff = %11.4g: Measure %11.4g %s %11.4g\n"
                  ,uVar3,uVar4,(ulong)uVar2,uVar1,uVar5);
      if ((local_7b & 1) != 0) {
        highsLogDev(local_20,(HighsLogType)local_28,(char *)(*(long *)(in_RDI + 8) + 0x380),4,
                    "   Incompatible signs for Col: %11.4g and Row: %11.4g\n");
      }
      if ((((local_79 & 1) != 0) || ((local_7b & 1) != 0)) && ((local_31 & 1) == 0)) {
        highsLogDev((HighsLogOptions *)(*(long *)(in_RDI + 8) + 0x380),kWarning,
                    "   Numerical trouble or wrong sign and not reinverting\n");
      }
      std::__cxx11::string::~string(local_a0);
      local_80 = 0;
    }
    else {
      local_80 = 1;
    }
    std::__cxx11::string::~string(local_78);
  }
  return;
}

Assistant:

void HEkk::debugReportReinvertOnNumericalTrouble(
    const std::string method_name, const double numerical_trouble_measure,
    const double alpha_from_col, const double alpha_from_row,
    const double numerical_trouble_tolerance, const bool reinvert) const {
  if (this->options_->highs_debug_level < kHighsDebugLevelCheap) return;
  const double abs_alpha_from_col = abs(alpha_from_col);
  const double abs_alpha_from_row = abs(alpha_from_row);
  const double abs_alpha_diff = abs(abs_alpha_from_col - abs_alpha_from_row);
  const HighsInt iteration_count = this->iteration_count_;
  const HighsInt update_count = this->info_.update_count;
  const std::string model_name = this->lp_.model_name_;

  const bool numerical_trouble =
      numerical_trouble_measure > numerical_trouble_tolerance;
  const bool near_numerical_trouble =
      10 * numerical_trouble_measure > numerical_trouble_tolerance;

  const bool wrong_sign = alpha_from_col * alpha_from_row <= 0;
  if (!near_numerical_trouble && !wrong_sign) return;
  std::string adjective;
  if (numerical_trouble) {
    adjective = "       exceeds";
  } else if (near_numerical_trouble) {
    adjective = "almost exceeds";
  } else {
    adjective = "clearly satisfies";
  }
  highsLogDev(this->options_->log_options, HighsLogType::kWarning,
              "%s (%s) [Iter %" HIGHSINT_FORMAT "; Update %" HIGHSINT_FORMAT
              "] Col: %11.4g; Row: %11.4g; Diff "
              "= %11.4g: Measure %11.4g %s %11.4g\n",
              method_name.c_str(), model_name.c_str(), iteration_count,
              update_count, abs_alpha_from_col, abs_alpha_from_row,
              abs_alpha_diff, numerical_trouble_measure, adjective.c_str(),
              numerical_trouble_tolerance);
  if (wrong_sign) {
    highsLogDev(this->options_->log_options, HighsLogType::kWarning,
                "   Incompatible signs for Col: %11.4g and Row: %11.4g\n",
                alpha_from_col, alpha_from_row);
  }
  if ((numerical_trouble || wrong_sign) && !reinvert) {
    highsLogDev(this->options_->log_options, HighsLogType::kWarning,
                "   Numerical trouble or wrong sign and not reinverting\n");
  }
}